

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O3

Expression * __thiscall
slang::ast::ContinuousAssignSymbol::getAssignment(ContinuousAssignSymbol *this)

{
  Scope *pSVar1;
  SyntaxNode *this_00;
  int iVar2;
  ExpressionSyntax *pEVar3;
  undefined4 extraout_var;
  LookupLocation LVar5;
  ASTContext context;
  Scope *local_50;
  uint32_t local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  Expression *pEVar4;
  
  pEVar4 = this->assign;
  if (pEVar4 == (Expression *)0x0) {
    pSVar1 = (this->super_Symbol).parentScope;
    if ((pSVar1 == (Scope *)0x0) ||
       (this_00 = (this->super_Symbol).originatingSyntax, this_00 == (SyntaxNode *)0x0)) {
      assert::assertFailed
                ("scope && syntax",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/MemberSymbols.cpp"
                 ,0x1b8,
                 "const Expression &slang::ast::ContinuousAssignSymbol::getAssignment() const");
    }
    LVar5 = LookupLocation::after(&this->super_Symbol);
    local_48 = LVar5.index;
    local_40 = 0x80;
    local_38 = 0;
    uStack_30 = 0;
    local_28 = 0;
    uStack_20 = 0;
    local_50 = pSVar1;
    if (LVar5.scope != pSVar1 && LVar5.scope != (Scope *)0x0) {
      assert::assertFailed
                ("!lookupLocation.getScope() || lookupLocation.getScope() == &scope",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/ASTContext.h"
                 ,0x119,
                 "slang::ast::ASTContext::ASTContext(const Scope &, LookupLocation, bitmask<ASTFlags>)"
                );
    }
    pEVar3 = slang::syntax::SyntaxNode::as<slang::syntax::ExpressionSyntax>(this_00);
    iVar2 = Expression::bind((int)pEVar3,(sockaddr *)&local_50,0x20);
    pEVar4 = (Expression *)CONCAT44(extraout_var,iVar2);
    this->assign = pEVar4;
  }
  return pEVar4;
}

Assistant:

const Expression& ContinuousAssignSymbol::getAssignment() const {
    if (assign)
        return *assign;

    auto scope = getParentScope();
    auto syntax = getSyntax();
    ASSERT(scope && syntax);

    ASTContext context(*scope, LookupLocation::after(*this), ASTFlags::NonProcedural);
    assign = &Expression::bind(syntax->as<ExpressionSyntax>(), context,
                               ASTFlags::AssignmentAllowed);

    return *assign;
}